

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O3

uint8_t * __thiscall
Lodtalk::MethodAssembler::PushReceiverVariable::encode(PushReceiverVariable *this,uint8_t *buffer)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  long lVar4;
  
  iVar1 = this->index;
  if ((0xf < iVar1 | this->longInstruction) == 1) {
    iVar2 = iVar1 + 0xff;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    InstructionNode::encodeExtA(&this->super_InstructionNode,buffer,(long)(iVar2 >> 8));
    *buffer = 0xe2;
    iVar1 = this->index;
    lVar4 = 2;
    puVar3 = buffer + 1;
  }
  else {
    lVar4 = 1;
    puVar3 = buffer;
  }
  *puVar3 = (uint8_t)iVar1;
  return buffer + lVar4;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
		if(!longInstruction && index < BytecodeSet::PushReceiverVariableShortRangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::PushReceiverVariableShortFirst + index);
			return buffer;
		}

        buffer = encodeExtA(buffer, index / 256);

		*buffer++ = BytecodeSet::PushReceiverVariable;
		*buffer++ = index % 256;
		return buffer;
	}